

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O0

array<unsigned_char,_4UL>
anon_unknown.dwarf_3633c::getBDMV_VersionNumber(BDMV_VersionNumber version)

{
  reference pvVar1;
  array<unsigned_char,_4UL> local_c;
  BDMV_VersionNumber version_local;
  array<unsigned_char,_4UL> rv;
  
  builtin_memcpy(local_c._M_elems,"0100",4);
  if (version == Version2) {
    pvVar1 = std::array<unsigned_char,_4UL>::operator[](&local_c,1);
    *pvVar1 = '2';
  }
  else if (version == Version3) {
    pvVar1 = std::array<unsigned_char,_4UL>::operator[](&local_c,1);
    *pvVar1 = '3';
  }
  return (array<unsigned_char,_4UL>)local_c._M_elems;
}

Assistant:

std::array<std::uint8_t, 4> getBDMV_VersionNumber(const BDMV_VersionNumber version)
{
    std::array<std::uint8_t, 4> rv = {0x30, 0x31, 0x30, 0x30};  // "0100"
    switch (version)
    {
    case BDMV_VersionNumber::Version2:
        rv[1] = 0x32;
        return rv;
    case BDMV_VersionNumber::Version3:
        rv[1] = 0x33;
        return rv;
    default:
        return rv;
    }
}